

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.cpp
# Opt level: O0

TypeDescriptor * orOperator(TypeDescriptor *leftValue,TypeDescriptor *rightValue)

{
  code *pcVar1;
  types *ptVar2;
  NumberDescriptor *this;
  double dVar3;
  bool local_41;
  NumberDescriptor *numEqual;
  TypeDescriptor *rightValue_local;
  TypeDescriptor *leftValue_local;
  
  ptVar2 = TypeDescriptor::type(leftValue);
  if ((*ptVar2 == NUMBER) && (ptVar2 = TypeDescriptor::type(rightValue), *ptVar2 == NUMBER)) {
    this = (NumberDescriptor *)operator_new(0x60);
    dVar3 = TypeDescriptor::getNumber(leftValue);
    local_41 = true;
    if ((dVar3 != 1.0) || (NAN(dVar3))) {
      dVar3 = TypeDescriptor::getNumber(rightValue);
      local_41 = dVar3 == 1.0;
    }
    NumberDescriptor::NumberDescriptor(this,(double)local_41);
    return &this->super_TypeDescriptor;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

TypeDescriptor *orOperator(TypeDescriptor *leftValue, TypeDescriptor *rightValue){
    if(leftValue->type() == TypeDescriptor::NUMBER
       && rightValue->type() == TypeDescriptor::NUMBER){
        auto *numEqual = new NumberDescriptor(leftValue->getNumber() == 1.0 || rightValue->getNumber() == 1.0);
        return numEqual;
    }
}